

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_scan_sse2_128_16.c
# Opt level: O2

parasail_result_t *
parasail_nw_table_scan_profile_sse2_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  ushort *puVar1;
  short *psVar2;
  void *pvVar3;
  parasail_matrix_t *ppVar4;
  int *piVar5;
  short sVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ulong uVar9;
  int iVar10;
  parasail_result_t *ppVar11;
  __m128i *ptr;
  int16_t *ptr_00;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *ptr_03;
  int iVar12;
  int iVar13;
  parasail_matrix_t *ppVar14;
  char *pcVar15;
  int16_t iVar16;
  uint uVar17;
  int iVar18;
  uint uVar19;
  long lVar20;
  char *__format;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  long lVar24;
  uint uVar25;
  long lVar26;
  ulong size;
  int iVar27;
  long lVar28;
  bool bVar29;
  undefined4 uVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  __m128i alVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  short sVar54;
  short sVar55;
  short sVar56;
  short sVar57;
  short sVar58;
  undefined1 auVar53 [16];
  undefined1 auVar59 [16];
  ushort uVar60;
  ushort uVar63;
  ushort uVar64;
  ushort uVar65;
  ushort uVar66;
  ushort uVar67;
  ushort uVar68;
  undefined1 auVar62 [16];
  ushort uVar69;
  long local_c8;
  __m128i_16_t e;
  __m128i_16_t h;
  short sVar30;
  short sVar35;
  short sVar48;
  short sVar61;
  short sVar70;
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar15 = "profile";
  }
  else {
    pvVar3 = (profile->profile16).score;
    if (pvVar3 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar15 = "profile->profile16.score";
    }
    else {
      ppVar4 = profile->matrix;
      if (ppVar4 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar15 = "profile->matrix";
      }
      else {
        uVar25 = profile->s1Len;
        if ((int)uVar25 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar15 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar15 = "s2";
        }
        else {
          uVar23 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            __format = "%s: %s must be > 0\n";
            pcVar15 = "s2Len";
          }
          else if (open < 0) {
            __format = "%s: %s must be >= 0\n";
            pcVar15 = "open";
          }
          else {
            if (-1 < gap) {
              uVar19 = uVar25 - 1;
              size = (ulong)uVar25 + 7 >> 3;
              iVar18 = -open;
              iVar13 = ppVar4->min;
              iVar27 = -iVar13;
              if (iVar13 != iVar18 && SBORROW4(iVar13,iVar18) == iVar13 + open < 0) {
                iVar27 = open;
              }
              iVar10 = ppVar4->max;
              ppVar14 = ppVar4;
              ppVar11 = parasail_result_new_table1((uint)((ulong)uVar25 + 7) & 0x7ffffff8,s2Len);
              uVar31 = SUB84(ppVar14,0);
              if (ppVar11 == (parasail_result_t *)0x0) {
                return (parasail_result_t *)0x0;
              }
              ppVar11->flag = ppVar11->flag | 0x8220401;
              ptr = parasail_memalign___m128i(0x10,size);
              ptr_00 = parasail_memalign_int16_t(0x10,(ulong)(s2Len + 1));
              ptr_01 = parasail_memalign___m128i(0x10,size);
              ptr_02 = parasail_memalign___m128i(0x10,size);
              ptr_03 = parasail_memalign___m128i(0x10,size);
              auVar32._0_4_ = -(uint)((int)((ulong)ptr >> 0x20) == 0 && (int)ptr == 0);
              auVar32._4_4_ = -(uint)((int)ptr_00 == 0 && (int)((ulong)ptr_00 >> 0x20) == 0);
              auVar32._8_4_ = -(uint)((int)((ulong)ptr_01 >> 0x20) == 0 && (int)ptr_01 == 0);
              auVar32._12_4_ = -(uint)((int)ptr_02 == 0 && (int)((ulong)ptr_02 >> 0x20) == 0);
              iVar12 = movmskps(uVar31,auVar32);
              if (iVar12 != 0) {
                return (parasail_result_t *)0x0;
              }
              if (ptr_03 == (__m128i *)0x0) {
                return (parasail_result_t *)0x0;
              }
              iVar12 = s2Len + -1;
              auVar32 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)open),0);
              uVar31 = auVar32._0_4_;
              auVar38._4_4_ = uVar31;
              auVar38._0_4_ = uVar31;
              auVar38._8_4_ = uVar31;
              auVar38._12_4_ = uVar31;
              auVar32 = pshuflw(ZEXT416((uint)gap),ZEXT416((uint)gap),0);
              uVar31 = auVar32._0_4_;
              uVar25 = iVar27 - 0x7fff;
              auVar32 = pshuflw(ZEXT416(uVar25),ZEXT416(uVar25),0);
              auVar33._0_4_ = auVar32._0_4_;
              auVar33._4_4_ = auVar33._0_4_;
              auVar33._8_4_ = auVar33._0_4_;
              auVar33._12_4_ = auVar33._0_4_;
              auVar36 = ZEXT416(CONCAT22((short)((uint)iVar13 >> 0x10),0x7ffe - (short)iVar10));
              auVar37 = pshuflw(auVar36,auVar36,0);
              auVar36._0_4_ = auVar37._0_4_;
              auVar36._4_4_ = auVar36._0_4_;
              auVar36._8_4_ = auVar36._0_4_;
              auVar36._12_4_ = auVar36._0_4_;
              iVar13 = (int)size;
              auVar39 = pshuflw(ZEXT416((uint)-(iVar13 * gap)),ZEXT416((uint)-(iVar13 * gap)),0);
              uVar17 = auVar39._0_4_;
              auVar39._0_8_ = CONCAT44(uVar17,uVar17);
              auVar39._8_4_ = uVar17;
              auVar39._12_4_ = uVar17;
              auVar40._0_8_ = auVar39._0_8_ << 0x10;
              auVar40._8_8_ = auVar39._8_8_ << 0x10 | (ulong)(uVar17 >> 0x10);
              auVar39 = paddsw(auVar40,ZEXT416(uVar25 & 0xffff));
              lVar20 = (long)iVar18;
              for (uVar21 = 0; uVar21 != size; uVar21 = uVar21 + 1) {
                lVar22 = lVar20;
                for (lVar28 = 0; lVar28 != 8; lVar28 = lVar28 + 1) {
                  lVar24 = -0x8000;
                  if (-0x8000 < lVar22) {
                    lVar24 = lVar22;
                  }
                  lVar26 = lVar22 - (ulong)(uint)open;
                  if (lVar26 < -0x7fff) {
                    lVar26 = -0x8000;
                  }
                  *(short *)((long)&h + lVar28 * 2) = (short)lVar24;
                  *(short *)((long)&e + lVar28 * 2) = (short)lVar26;
                  lVar22 = lVar22 - size * (uint)gap;
                }
                ptr_02[uVar21][0] = h.m[0];
                ptr_02[uVar21][1] = h.m[1];
                ptr[uVar21][0] = e.m[0];
                ptr[uVar21][1] = e.m[1];
                lVar20 = lVar20 - (ulong)(uint)gap;
              }
              *ptr_00 = 0;
              for (uVar21 = 1; s2Len + 1 != uVar21; uVar21 = uVar21 + 1) {
                iVar16 = -0x8000;
                if (-0x8000 < iVar18) {
                  iVar16 = (int16_t)iVar18;
                }
                ptr_00[uVar21] = iVar16;
                iVar18 = iVar18 - gap;
              }
              alVar41 = (__m128i)psubsw((undefined1  [16])0x0,auVar38);
              for (uVar17 = iVar13 - 1U; -1 < (int)uVar17; uVar17 = uVar17 - 1) {
                ptr_03[uVar17] = alVar41;
                auVar50._4_4_ = uVar31;
                auVar50._0_4_ = uVar31;
                auVar50._8_4_ = uVar31;
                auVar50._12_4_ = uVar31;
                alVar41 = (__m128i)psubsw((undefined1  [16])alVar41,auVar50);
              }
              lVar20 = size * uVar23;
              local_c8 = 0;
              uVar21 = 0;
              auVar40 = auVar33;
              while (uVar21 != uVar23) {
                uVar9 = ptr_02[iVar13 - 1U][0];
                auVar46._8_8_ = ptr_02[iVar13 - 1U][1] << 0x10 | uVar9 >> 0x30;
                auVar46._0_8_ = uVar9 << 0x10 | (ulong)(ushort)ptr_00[uVar21];
                iVar27 = ppVar4->mapper[(byte)s2[uVar21]];
                auVar45 = psubsw(auVar33,(undefined1  [16])*ptr_03);
                lVar22 = 0;
                auVar59 = auVar33;
                while( true ) {
                  sVar30 = auVar59._0_2_;
                  sVar35 = auVar59._2_2_;
                  sVar48 = auVar59._4_2_;
                  sVar54 = auVar59._6_2_;
                  sVar55 = auVar59._8_2_;
                  sVar56 = auVar59._10_2_;
                  sVar57 = auVar59._12_2_;
                  sVar58 = auVar59._14_2_;
                  if (size << 4 == lVar22) break;
                  auVar50 = *(undefined1 (*) [16])((long)*ptr_02 + lVar22);
                  auVar7._4_4_ = uVar31;
                  auVar7._0_4_ = uVar31;
                  auVar7._8_4_ = uVar31;
                  auVar7._12_4_ = uVar31;
                  auVar59 = psubsw(*(undefined1 (*) [16])((long)*ptr + lVar22),auVar7);
                  auVar62 = psubsw(auVar50,auVar38);
                  auVar49 = paddsw(auVar46,*(undefined1 (*) [16])
                                            ((long)pvVar3 + lVar22 + (long)(iVar27 * iVar13) * 0x10)
                                  );
                  auVar46 = paddsw(auVar45,*(undefined1 (*) [16])((long)*ptr_03 + lVar22));
                  sVar6 = auVar59._0_2_;
                  sVar61 = auVar62._0_2_;
                  uVar60 = (ushort)(sVar61 < sVar6) * sVar6 | (ushort)(sVar61 >= sVar6) * sVar61;
                  sVar6 = auVar59._2_2_;
                  sVar61 = auVar62._2_2_;
                  uVar63 = (ushort)(sVar61 < sVar6) * sVar6 | (ushort)(sVar61 >= sVar6) * sVar61;
                  sVar6 = auVar59._4_2_;
                  sVar61 = auVar62._4_2_;
                  uVar64 = (ushort)(sVar61 < sVar6) * sVar6 | (ushort)(sVar61 >= sVar6) * sVar61;
                  sVar6 = auVar59._6_2_;
                  sVar61 = auVar62._6_2_;
                  uVar65 = (ushort)(sVar61 < sVar6) * sVar6 | (ushort)(sVar61 >= sVar6) * sVar61;
                  sVar6 = auVar59._8_2_;
                  sVar61 = auVar62._8_2_;
                  uVar66 = (ushort)(sVar61 < sVar6) * sVar6 | (ushort)(sVar61 >= sVar6) * sVar61;
                  sVar6 = auVar59._10_2_;
                  sVar61 = auVar62._10_2_;
                  uVar67 = (ushort)(sVar61 < sVar6) * sVar6 | (ushort)(sVar61 >= sVar6) * sVar61;
                  sVar6 = auVar59._12_2_;
                  sVar61 = auVar62._12_2_;
                  sVar70 = auVar62._14_2_;
                  uVar68 = (ushort)(sVar61 < sVar6) * sVar6 | (ushort)(sVar61 >= sVar6) * sVar61;
                  sVar6 = auVar59._14_2_;
                  uVar69 = (ushort)(sVar70 < sVar6) * sVar6 | (ushort)(sVar70 >= sVar6) * sVar70;
                  sVar6 = auVar46._0_2_;
                  auVar59._0_2_ =
                       (ushort)(sVar30 < sVar6) * sVar6 | (ushort)(sVar30 >= sVar6) * sVar30;
                  sVar30 = auVar46._2_2_;
                  auVar59._2_2_ =
                       (ushort)(sVar35 < sVar30) * sVar30 | (ushort)(sVar35 >= sVar30) * sVar35;
                  sVar30 = auVar46._4_2_;
                  auVar59._4_2_ =
                       (ushort)(sVar48 < sVar30) * sVar30 | (ushort)(sVar48 >= sVar30) * sVar48;
                  sVar30 = auVar46._6_2_;
                  auVar59._6_2_ =
                       (ushort)(sVar54 < sVar30) * sVar30 | (ushort)(sVar54 >= sVar30) * sVar54;
                  sVar30 = auVar46._8_2_;
                  auVar59._8_2_ =
                       (ushort)(sVar55 < sVar30) * sVar30 | (ushort)(sVar55 >= sVar30) * sVar55;
                  sVar30 = auVar46._10_2_;
                  auVar59._10_2_ =
                       (ushort)(sVar56 < sVar30) * sVar30 | (ushort)(sVar56 >= sVar30) * sVar56;
                  sVar30 = auVar46._12_2_;
                  auVar59._12_2_ =
                       (ushort)(sVar57 < sVar30) * sVar30 | (ushort)(sVar57 >= sVar30) * sVar57;
                  sVar30 = auVar46._14_2_;
                  auVar59._14_2_ =
                       (ushort)(sVar58 < sVar30) * sVar30 | (ushort)(sVar58 >= sVar30) * sVar58;
                  sVar30 = auVar49._0_2_;
                  auVar45._0_2_ =
                       (sVar30 < (short)uVar60) * uVar60 |
                       (ushort)(sVar30 >= (short)uVar60) * sVar30;
                  sVar30 = auVar49._2_2_;
                  auVar45._2_2_ =
                       (sVar30 < (short)uVar63) * uVar63 |
                       (ushort)(sVar30 >= (short)uVar63) * sVar30;
                  sVar30 = auVar49._4_2_;
                  auVar45._4_2_ =
                       (sVar30 < (short)uVar64) * uVar64 |
                       (ushort)(sVar30 >= (short)uVar64) * sVar30;
                  sVar30 = auVar49._6_2_;
                  auVar45._6_2_ =
                       (sVar30 < (short)uVar65) * uVar65 |
                       (ushort)(sVar30 >= (short)uVar65) * sVar30;
                  sVar30 = auVar49._8_2_;
                  auVar45._8_2_ =
                       (sVar30 < (short)uVar66) * uVar66 |
                       (ushort)(sVar30 >= (short)uVar66) * sVar30;
                  sVar30 = auVar49._10_2_;
                  auVar45._10_2_ =
                       (sVar30 < (short)uVar67) * uVar67 |
                       (ushort)(sVar30 >= (short)uVar67) * sVar30;
                  sVar30 = auVar49._12_2_;
                  sVar35 = auVar49._14_2_;
                  auVar45._12_2_ =
                       (sVar30 < (short)uVar68) * uVar68 |
                       (ushort)(sVar30 >= (short)uVar68) * sVar30;
                  auVar45._14_2_ =
                       (sVar35 < (short)uVar69) * uVar69 |
                       (ushort)(sVar35 >= (short)uVar69) * sVar35;
                  puVar1 = (ushort *)((long)*ptr + lVar22);
                  *puVar1 = uVar60;
                  puVar1[1] = uVar63;
                  puVar1[2] = uVar64;
                  puVar1[3] = uVar65;
                  puVar1[4] = uVar66;
                  puVar1[5] = uVar67;
                  puVar1[6] = uVar68;
                  puVar1[7] = uVar69;
                  *(undefined1 (*) [16])((long)*ptr_01 + lVar22) = auVar45;
                  lVar22 = lVar22 + 0x10;
                  auVar46 = auVar50;
                }
                auVar62._8_8_ = auVar45._8_8_ << 0x10 | auVar45._0_8_ >> 0x30;
                uVar60 = ptr_00[uVar21 + 1];
                auVar62._0_8_ = auVar45._0_8_ << 0x10 | (ulong)uVar60;
                uVar21 = uVar21 + 1;
                auVar50 = paddsw((undefined1  [16])*ptr_03,auVar62);
                sVar6 = auVar50._0_2_;
                auVar49._0_2_ =
                     (ushort)(sVar30 < sVar6) * sVar6 | (ushort)(sVar30 >= sVar6) * sVar30;
                sVar30 = auVar50._2_2_;
                auVar49._2_2_ =
                     (ushort)(sVar35 < sVar30) * sVar30 | (ushort)(sVar35 >= sVar30) * sVar35;
                sVar30 = auVar50._4_2_;
                auVar49._4_2_ =
                     (ushort)(sVar48 < sVar30) * sVar30 | (ushort)(sVar48 >= sVar30) * sVar48;
                sVar30 = auVar50._6_2_;
                auVar49._6_2_ =
                     (ushort)(sVar54 < sVar30) * sVar30 | (ushort)(sVar54 >= sVar30) * sVar54;
                sVar30 = auVar50._8_2_;
                auVar49._8_2_ =
                     (ushort)(sVar55 < sVar30) * sVar30 | (ushort)(sVar55 >= sVar30) * sVar55;
                sVar30 = auVar50._10_2_;
                auVar49._10_2_ =
                     (ushort)(sVar56 < sVar30) * sVar30 | (ushort)(sVar56 >= sVar30) * sVar56;
                sVar30 = auVar50._12_2_;
                auVar49._12_2_ =
                     (ushort)(sVar57 < sVar30) * sVar30 | (ushort)(sVar57 >= sVar30) * sVar57;
                sVar30 = auVar50._14_2_;
                auVar49._14_2_ =
                     (ushort)(sVar58 < sVar30) * sVar30 | (ushort)(sVar58 >= sVar30) * sVar58;
                iVar27 = 6;
                while( true ) {
                  auVar51._0_8_ = auVar49._0_8_ << 0x10;
                  auVar51._8_8_ = auVar49._8_8_ << 0x10 | auVar49._0_8_ >> 0x30;
                  bVar29 = iVar27 == 0;
                  iVar27 = iVar27 + -1;
                  if (bVar29) break;
                  auVar50 = paddsw(auVar51,auVar39);
                  sVar30 = auVar50._0_2_;
                  sVar35 = auVar49._0_2_;
                  auVar53._0_2_ =
                       (ushort)(sVar35 < sVar30) * sVar30 | (ushort)(sVar35 >= sVar30) * sVar35;
                  sVar30 = auVar50._2_2_;
                  sVar35 = auVar49._2_2_;
                  auVar53._2_2_ =
                       (ushort)(sVar35 < sVar30) * sVar30 | (ushort)(sVar35 >= sVar30) * sVar35;
                  sVar30 = auVar50._4_2_;
                  sVar35 = auVar49._4_2_;
                  auVar53._4_2_ =
                       (ushort)(sVar35 < sVar30) * sVar30 | (ushort)(sVar35 >= sVar30) * sVar35;
                  sVar30 = auVar50._6_2_;
                  sVar35 = auVar49._6_2_;
                  auVar53._6_2_ =
                       (ushort)(sVar35 < sVar30) * sVar30 | (ushort)(sVar35 >= sVar30) * sVar35;
                  sVar30 = auVar50._8_2_;
                  sVar35 = auVar49._8_2_;
                  auVar53._8_2_ =
                       (ushort)(sVar35 < sVar30) * sVar30 | (ushort)(sVar35 >= sVar30) * sVar35;
                  sVar30 = auVar50._10_2_;
                  sVar35 = auVar49._10_2_;
                  auVar53._10_2_ =
                       (ushort)(sVar35 < sVar30) * sVar30 | (ushort)(sVar35 >= sVar30) * sVar35;
                  sVar30 = auVar50._12_2_;
                  sVar35 = auVar49._12_2_;
                  sVar48 = auVar49._14_2_;
                  auVar53._12_2_ =
                       (ushort)(sVar35 < sVar30) * sVar30 | (ushort)(sVar35 >= sVar30) * sVar35;
                  sVar30 = auVar50._14_2_;
                  auVar53._14_2_ =
                       (ushort)(sVar48 < sVar30) * sVar30 | (ushort)(sVar48 >= sVar30) * sVar48;
                  auVar49 = auVar53;
                }
                auVar52 = paddsw(auVar51,ZEXT416(uVar25 & 0xffff));
                sVar30 = auVar52._0_2_;
                auVar47._0_2_ =
                     (ushort)((short)uVar60 < sVar30) * sVar30 | ((short)uVar60 >= sVar30) * uVar60;
                sVar30 = auVar52._2_2_;
                sVar35 = auVar45._0_2_;
                auVar47._2_2_ =
                     (ushort)(sVar35 < sVar30) * sVar30 | (ushort)(sVar35 >= sVar30) * sVar35;
                sVar30 = auVar52._4_2_;
                sVar35 = auVar45._2_2_;
                auVar47._4_2_ =
                     (ushort)(sVar35 < sVar30) * sVar30 | (ushort)(sVar35 >= sVar30) * sVar35;
                sVar30 = auVar52._6_2_;
                sVar35 = auVar45._4_2_;
                auVar47._6_2_ =
                     (ushort)(sVar35 < sVar30) * sVar30 | (ushort)(sVar35 >= sVar30) * sVar35;
                sVar30 = auVar52._8_2_;
                sVar35 = auVar45._6_2_;
                auVar47._8_2_ =
                     (ushort)(sVar35 < sVar30) * sVar30 | (ushort)(sVar35 >= sVar30) * sVar35;
                sVar30 = auVar52._10_2_;
                sVar35 = auVar45._8_2_;
                auVar47._10_2_ =
                     (ushort)(sVar35 < sVar30) * sVar30 | (ushort)(sVar35 >= sVar30) * sVar35;
                sVar30 = auVar52._12_2_;
                sVar35 = auVar45._10_2_;
                sVar48 = auVar45._12_2_;
                auVar47._12_2_ =
                     (ushort)(sVar35 < sVar30) * sVar30 | (ushort)(sVar35 >= sVar30) * sVar35;
                sVar30 = auVar52._14_2_;
                auVar47._14_2_ =
                     (ushort)(sVar48 < sVar30) * sVar30 | (ushort)(sVar48 >= sVar30) * sVar48;
                lVar22 = local_c8;
                for (lVar28 = 0; size << 4 != lVar28; lVar28 = lVar28 + 0x10) {
                  auVar8._4_4_ = uVar31;
                  auVar8._0_4_ = uVar31;
                  auVar8._8_4_ = uVar31;
                  auVar8._12_4_ = uVar31;
                  auVar46 = psubsw(auVar52,auVar8);
                  auVar50 = psubsw(auVar47,auVar38);
                  sVar30 = auVar50._0_2_;
                  sVar35 = auVar46._0_2_;
                  auVar52._0_2_ =
                       (ushort)(sVar35 < sVar30) * sVar30 | (ushort)(sVar35 >= sVar30) * sVar35;
                  sVar30 = auVar50._2_2_;
                  sVar35 = auVar46._2_2_;
                  auVar52._2_2_ =
                       (ushort)(sVar35 < sVar30) * sVar30 | (ushort)(sVar35 >= sVar30) * sVar35;
                  sVar30 = auVar50._4_2_;
                  sVar35 = auVar46._4_2_;
                  auVar52._4_2_ =
                       (ushort)(sVar35 < sVar30) * sVar30 | (ushort)(sVar35 >= sVar30) * sVar35;
                  sVar30 = auVar50._6_2_;
                  sVar35 = auVar46._6_2_;
                  auVar52._6_2_ =
                       (ushort)(sVar35 < sVar30) * sVar30 | (ushort)(sVar35 >= sVar30) * sVar35;
                  sVar30 = auVar50._8_2_;
                  sVar35 = auVar46._8_2_;
                  auVar52._8_2_ =
                       (ushort)(sVar35 < sVar30) * sVar30 | (ushort)(sVar35 >= sVar30) * sVar35;
                  sVar30 = auVar50._10_2_;
                  sVar35 = auVar46._10_2_;
                  auVar52._10_2_ =
                       (ushort)(sVar35 < sVar30) * sVar30 | (ushort)(sVar35 >= sVar30) * sVar35;
                  sVar30 = auVar50._12_2_;
                  sVar35 = auVar46._12_2_;
                  sVar48 = auVar46._14_2_;
                  auVar52._12_2_ =
                       (ushort)(sVar35 < sVar30) * sVar30 | (ushort)(sVar35 >= sVar30) * sVar35;
                  sVar30 = auVar50._14_2_;
                  auVar52._14_2_ =
                       (ushort)(sVar48 < sVar30) * sVar30 | (ushort)(sVar48 >= sVar30) * sVar48;
                  psVar2 = (short *)((long)*ptr_01 + lVar28);
                  sVar30 = *psVar2;
                  sVar35 = psVar2[1];
                  sVar48 = psVar2[2];
                  sVar54 = psVar2[3];
                  sVar55 = psVar2[4];
                  sVar56 = psVar2[5];
                  sVar57 = psVar2[6];
                  sVar58 = psVar2[7];
                  auVar47._0_2_ =
                       (sVar30 < (short)auVar52._0_2_) * auVar52._0_2_ |
                       (ushort)(sVar30 >= (short)auVar52._0_2_) * sVar30;
                  auVar47._2_2_ =
                       (sVar35 < (short)auVar52._2_2_) * auVar52._2_2_ |
                       (ushort)(sVar35 >= (short)auVar52._2_2_) * sVar35;
                  auVar47._4_2_ =
                       (sVar48 < (short)auVar52._4_2_) * auVar52._4_2_ |
                       (ushort)(sVar48 >= (short)auVar52._4_2_) * sVar48;
                  auVar47._6_2_ =
                       (sVar54 < (short)auVar52._6_2_) * auVar52._6_2_ |
                       (ushort)(sVar54 >= (short)auVar52._6_2_) * sVar54;
                  auVar47._8_2_ =
                       (sVar55 < (short)auVar52._8_2_) * auVar52._8_2_ |
                       (ushort)(sVar55 >= (short)auVar52._8_2_) * sVar55;
                  auVar47._10_2_ =
                       (sVar56 < (short)auVar52._10_2_) * auVar52._10_2_ |
                       (ushort)(sVar56 >= (short)auVar52._10_2_) * sVar56;
                  auVar47._12_2_ =
                       (sVar57 < (short)auVar52._12_2_) * auVar52._12_2_ |
                       (ushort)(sVar57 >= (short)auVar52._12_2_) * sVar57;
                  auVar47._14_2_ =
                       (sVar58 < (short)auVar52._14_2_) * auVar52._14_2_ |
                       (ushort)(sVar58 >= (short)auVar52._14_2_) * sVar58;
                  *(undefined1 (*) [16])((long)*ptr_02 + lVar28) = auVar47;
                  sVar30 = auVar36._0_2_;
                  auVar44._0_2_ =
                       ((short)auVar47._0_2_ < sVar30) * auVar47._0_2_ |
                       (ushort)((short)auVar47._0_2_ >= sVar30) * sVar30;
                  sVar30 = auVar36._2_2_;
                  auVar44._2_2_ =
                       ((short)auVar47._2_2_ < sVar30) * auVar47._2_2_ |
                       (ushort)((short)auVar47._2_2_ >= sVar30) * sVar30;
                  sVar30 = auVar36._4_2_;
                  auVar44._4_2_ =
                       ((short)auVar47._4_2_ < sVar30) * auVar47._4_2_ |
                       (ushort)((short)auVar47._4_2_ >= sVar30) * sVar30;
                  sVar30 = auVar36._6_2_;
                  auVar44._6_2_ =
                       ((short)auVar47._6_2_ < sVar30) * auVar47._6_2_ |
                       (ushort)((short)auVar47._6_2_ >= sVar30) * sVar30;
                  sVar30 = auVar36._8_2_;
                  auVar44._8_2_ =
                       ((short)auVar47._8_2_ < sVar30) * auVar47._8_2_ |
                       (ushort)((short)auVar47._8_2_ >= sVar30) * sVar30;
                  sVar30 = auVar36._10_2_;
                  auVar44._10_2_ =
                       ((short)auVar47._10_2_ < sVar30) * auVar47._10_2_ |
                       (ushort)((short)auVar47._10_2_ >= sVar30) * sVar30;
                  sVar30 = auVar36._12_2_;
                  sVar35 = auVar36._14_2_;
                  auVar44._12_2_ =
                       ((short)auVar47._12_2_ < sVar30) * auVar47._12_2_ |
                       (ushort)((short)auVar47._12_2_ >= sVar30) * sVar30;
                  auVar44._14_2_ =
                       ((short)auVar47._14_2_ < sVar35) * auVar47._14_2_ |
                       (ushort)((short)auVar47._14_2_ >= sVar35) * sVar35;
                  sVar30 = auVar40._0_2_;
                  auVar42._0_2_ =
                       (sVar30 < (short)auVar47._0_2_) * auVar47._0_2_ |
                       (ushort)(sVar30 >= (short)auVar47._0_2_) * sVar30;
                  sVar30 = auVar40._2_2_;
                  auVar42._2_2_ =
                       (sVar30 < (short)auVar47._2_2_) * auVar47._2_2_ |
                       (ushort)(sVar30 >= (short)auVar47._2_2_) * sVar30;
                  sVar30 = auVar40._4_2_;
                  auVar42._4_2_ =
                       (sVar30 < (short)auVar47._4_2_) * auVar47._4_2_ |
                       (ushort)(sVar30 >= (short)auVar47._4_2_) * sVar30;
                  sVar30 = auVar40._6_2_;
                  auVar42._6_2_ =
                       (sVar30 < (short)auVar47._6_2_) * auVar47._6_2_ |
                       (ushort)(sVar30 >= (short)auVar47._6_2_) * sVar30;
                  sVar30 = auVar40._8_2_;
                  auVar42._8_2_ =
                       (sVar30 < (short)auVar47._8_2_) * auVar47._8_2_ |
                       (ushort)(sVar30 >= (short)auVar47._8_2_) * sVar30;
                  sVar30 = auVar40._10_2_;
                  auVar42._10_2_ =
                       (sVar30 < (short)auVar47._10_2_) * auVar47._10_2_ |
                       (ushort)(sVar30 >= (short)auVar47._10_2_) * sVar30;
                  sVar30 = auVar40._12_2_;
                  sVar35 = auVar40._14_2_;
                  auVar42._12_2_ =
                       (sVar30 < (short)auVar47._12_2_) * auVar47._12_2_ |
                       (ushort)(sVar30 >= (short)auVar47._12_2_) * sVar30;
                  auVar42._14_2_ =
                       (sVar35 < (short)auVar47._14_2_) * auVar47._14_2_ |
                       (ushort)(sVar35 >= (short)auVar47._14_2_) * sVar35;
                  piVar5 = ((ppVar11->field_4).rowcols)->score_row;
                  *(int *)((long)piVar5 + lVar22) = (int)(short)auVar47._0_2_;
                  *(int *)((long)piVar5 + lVar20 * 4 + lVar22) = (int)(short)auVar47._2_2_;
                  *(int *)((long)piVar5 + lVar20 * 8 + lVar22) = (int)(short)auVar47._4_2_;
                  *(int *)((long)piVar5 + lVar20 * 0xc + lVar22) = (int)(short)auVar47._6_2_;
                  *(int *)((long)piVar5 + lVar20 * 0x10 + lVar22) = (int)(short)auVar47._8_2_;
                  *(int *)((long)piVar5 + lVar20 * 0x14 + lVar22) = (int)(short)auVar47._10_2_;
                  *(int *)((long)piVar5 + lVar20 * 0x18 + lVar22) = (int)(short)auVar47._12_2_;
                  *(int *)((long)piVar5 + lVar20 * 0x1c + lVar22) = (int)(short)auVar47._14_2_;
                  lVar22 = lVar22 + uVar23 * 4;
                  auVar40 = auVar42;
                  auVar36 = auVar44;
                }
                local_c8 = local_c8 + 4;
              }
              alVar41 = ptr_02[(ulong)uVar19 % size];
              iVar13 = 0;
              while( true ) {
                uVar23 = alVar41[0];
                lVar20 = alVar41[1];
                if (7 - (int)(uVar19 / size) <= iVar13) break;
                alVar41[0] = uVar23 << 0x10;
                alVar41[1] = lVar20 << 0x10 | uVar23 >> 0x30;
                iVar13 = iVar13 + 1;
              }
              sVar30 = auVar32._0_2_;
              auVar34._0_2_ = -(ushort)(auVar36._0_2_ < sVar30);
              sVar35 = auVar32._2_2_;
              auVar34._2_2_ = -(ushort)(auVar36._2_2_ < sVar35);
              auVar34._4_2_ = -(ushort)(auVar36._4_2_ < sVar30);
              auVar34._6_2_ = -(ushort)(auVar36._6_2_ < sVar35);
              auVar34._8_2_ = -(ushort)(auVar36._8_2_ < sVar30);
              auVar34._10_2_ = -(ushort)(auVar36._10_2_ < sVar35);
              auVar34._12_2_ = -(ushort)(auVar36._12_2_ < sVar30);
              auVar34._14_2_ = -(ushort)(auVar36._14_2_ < sVar35);
              sVar30 = auVar37._0_2_;
              auVar43._0_2_ = -(ushort)(sVar30 < auVar40._0_2_);
              sVar35 = auVar37._2_2_;
              auVar43._2_2_ = -(ushort)(sVar35 < auVar40._2_2_);
              auVar43._4_2_ = -(ushort)(sVar30 < auVar40._4_2_);
              auVar43._6_2_ = -(ushort)(sVar35 < auVar40._6_2_);
              auVar43._8_2_ = -(ushort)(sVar30 < auVar40._8_2_);
              auVar43._10_2_ = -(ushort)(sVar35 < auVar40._10_2_);
              auVar43._12_2_ = -(ushort)(sVar30 < auVar40._12_2_);
              auVar43._14_2_ = -(ushort)(sVar35 < auVar40._14_2_);
              auVar43 = auVar43 | auVar34;
              if ((((((((((((((((auVar43 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                               (auVar43 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                              (auVar43 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                             (auVar43 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar43 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar43 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar43 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar43 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar43 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar43 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar43 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar43 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar43 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar43 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar43 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar43[0xf]) {
                sVar30 = alVar41[1]._6_2_;
              }
              else {
                *(byte *)&ppVar11->flag = (byte)ppVar11->flag | 0x40;
                sVar30 = 0;
                iVar12 = 0;
                uVar19 = 0;
              }
              ppVar11->score = (int)sVar30;
              ppVar11->end_query = uVar19;
              ppVar11->end_ref = iVar12;
              parasail_free(ptr_03);
              parasail_free(ptr_02);
              parasail_free(ptr_01);
              parasail_free(ptr_00);
              parasail_free(ptr);
              return ppVar11;
            }
            __format = "%s: %s must be >= 0\n";
            pcVar15 = "gap";
          }
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_nw_table_scan_profile_sse2_128_16",pcVar15);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvE = NULL;
    int16_t* restrict boundary = NULL;
    __m128i* restrict pvHt = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    __m128i vZero;
    int16_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP = (__m128i*)profile->profile16.score;
    vGapO = _mm_set1_epi16(open);
    vGapE = _mm_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInfFront = vZero;
    vNegInfFront = _mm_insert_epi16(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_adds_epi16(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi16(-segLen*gap), 2));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int16_t(16, s2Len+1);
    pvHt= parasail_memalign___m128i(16, segLen);
    pvH = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!boundary) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvGapper) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_16_t h;
            __m128i_16_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
            }
            _mm_store_si128(&pvH[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT16_MIN ? INT16_MIN : tmp;
        }
    }

    {
        __m128i vGapper = _mm_subs_epi16(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            vGapper = _mm_subs_epi16(vGapper, vGapE);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vHt;
        __m128i vF;
        __m128i vH;
        __m128i vHp;
        __m128i *pvW;
        __m128i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHp = _mm_slli_si128(vHp, 2);
        vHp = _mm_insert_epi16(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm_subs_epi16(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vE = _mm_load_si128(pvE+i);
            vW = _mm_load_si128(pvW+i);
            vE = _mm_max_epi16(
                    _mm_subs_epi16(vE, vGapE),
                    _mm_subs_epi16(vH, vGapO));
            vHp = _mm_adds_epi16(vHp, vW);
            vF = _mm_max_epi16(vF, _mm_adds_epi16(vHt, pvGapper[i]));
            vHt = _mm_max_epi16(vE, vHp);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 2);
        vHt = _mm_insert_epi16(vHt, boundary[j+1], 0);
        vF = _mm_max_epi16(vF, _mm_adds_epi16(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 2);
            vFt = _mm_adds_epi16(vFt, vSegLenXgap);
            vF = _mm_max_epi16(vF, vFt);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 2);
        vF = _mm_adds_epi16(vF, vNegInfFront);
        vH = _mm_max_epi16(vHt, vF);
        for (i=0; i<segLen; ++i) {
            vHt = _mm_load_si128(pvHt+i);
            vF = _mm_max_epi16(
                    _mm_subs_epi16(vF, vGapE),
                    _mm_subs_epi16(vH, vGapO));
            vH = _mm_max_epi16(vHt, vF);
            _mm_store_si128(pvH+i, vH);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
        } 


#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
            }
            result->rowcols->score_row[j] = (int16_t) _mm_extract_epi16 (vH, 7);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvH + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128(vH, 2);
        }
        score = (int16_t) _mm_extract_epi16 (vH, 7);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(boundary);
    parasail_free(pvE);

    return result;
}